

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_suite.cpp
# Opt level: O3

void to_suite::run(void)

{
  convert_null();
  convert_boolean();
  convert_integer();
  convert_real();
  convert_string();
  convert_array();
  return;
}

Assistant:

void run()
{
    convert_null();
    convert_boolean();
    convert_integer();
    convert_real();
    convert_string();
    convert_array();
}